

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadCertificate.h
# Opt level: O3

string * generate_cert(string *__return_storage_ptr__,string *domain_name,string *main_dirpath)

{
  _Alloc_hider _Var1;
  string *main_dirpath_00;
  char cVar2;
  int iVar3;
  long *plVar4;
  path *__p;
  undefined8 uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string *__return_storage_ptr___00;
  bool bVar9;
  string ext_filepath;
  string path_string;
  directory_iterator __begin1;
  string crt_dirpath;
  string command;
  string local_310;
  path local_2f0;
  string *local_2c8;
  directory_iterator local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string_type local_280;
  string *local_260;
  string *local_258;
  long *local_250 [2];
  long local_240 [2];
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  local_2c8 = domain_name;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&mut);
  if (iVar3 != 0) {
    uVar5 = std::__throw_system_error(iVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_pathname._M_dataplus._M_p != &local_2f0._M_pathname.field_2) {
      operator_delete(local_2f0._M_pathname._M_dataplus._M_p,
                      local_2f0._M_pathname.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)local_230);
    if (local_2c0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2c0._M_dir._M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&mut);
    _Unwind_Resume(uVar5);
  }
  paVar8 = &local_2f0._M_pathname.field_2;
  local_2f0._M_pathname._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"/","");
  plVar4 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_2f0,0,(char *)0x0,
                              (ulong)(main_dirpath->_M_dataplus)._M_p);
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar6) {
    local_220[0]._0_8_ = paVar6->_M_allocated_capacity;
    local_220[0]._8_8_ = plVar4[3];
    local_230 = (undefined1  [8])local_220;
  }
  else {
    local_220[0]._0_8_ = paVar6->_M_allocated_capacity;
    local_230 = (undefined1  [8])*plVar4;
  }
  local_228 = plVar4[1];
  *plVar4 = (long)paVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_230);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2a0.field_2._M_allocated_capacity = *psVar7;
    local_2a0.field_2._8_8_ = plVar4[3];
  }
  else {
    local_2a0.field_2._M_allocated_capacity = *psVar7;
    local_2a0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_2a0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_230 != (undefined1  [8])local_220) {
    operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_pathname._M_dataplus._M_p != paVar8) {
    operator_delete(local_2f0._M_pathname._M_dataplus._M_p,
                    local_2f0._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_230,&local_2a0,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&local_280,(path *)local_230,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path((path *)local_230);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._M_string_length ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_2c0._M_dir._M_ptr = (element_type *)local_280._M_dataplus._M_p;
    local_2c0._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_280._M_string_length + 8) =
           *(_Atomic_word *)(local_280._M_string_length + 8) + 1;
      UNLOCK();
      local_2c0._M_dir._M_ptr = (element_type *)local_280._M_dataplus._M_p;
      local_2c0._M_dir._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._M_string_length;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00110177;
    }
    else {
      *(_Atomic_word *)(local_280._M_string_length + 8) =
           *(_Atomic_word *)(local_280._M_string_length + 8) + 1;
    }
    local_2c0._M_dir._M_ptr = (element_type *)local_280._M_dataplus._M_p;
    local_2c0._M_dir._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._M_string_length;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_280._M_string_length + 8) =
           *(_Atomic_word *)(local_280._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_280._M_string_length + 8) =
           *(_Atomic_word *)(local_280._M_string_length + 8) + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._M_string_length);
  }
LAB_00110177:
  local_260 = __return_storage_ptr__;
  local_258 = main_dirpath;
  do {
    paVar8 = &local_2f0._M_pathname.field_2;
    if (local_2c0._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._M_string_length);
      }
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_310,local_2a0._M_dataplus._M_p,
                 local_2a0._M_dataplus._M_p + local_2a0._M_string_length);
      main_dirpath_00 = local_258;
      std::__cxx11::string::append((char *)&local_310);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_310,(ulong)(local_2c8->_M_dataplus)._M_p);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_2f0._M_pathname.field_2._M_allocated_capacity = *psVar7;
        local_2f0._M_pathname.field_2._8_8_ = plVar4[3];
        local_2f0._M_pathname._M_dataplus._M_p = (pointer)paVar8;
      }
      else {
        local_2f0._M_pathname.field_2._M_allocated_capacity = *psVar7;
        local_2f0._M_pathname._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_2f0._M_pathname._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::filesystem::__cxx11::path::path((path *)local_230,&local_2f0._M_pathname,auto_format);
      std::filesystem::create_directories((path *)local_230);
      std::filesystem::__cxx11::path::~path((path *)local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_pathname._M_dataplus._M_p != paVar8) {
        operator_delete(local_2f0._M_pathname._M_dataplus._M_p,
                        local_2f0._M_pathname.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      local_230 = (undefined1  [8])local_220;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"domains.ext","");
      build_path(&local_310,&local_2a0,local_2c8,(string *)local_230);
      if (local_230 != (undefined1  [8])local_220) {
        operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
      }
      local_250[0] = local_240;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"/","");
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_250,0,(char *)0x0,
                                  (ulong)(main_dirpath_00->_M_dataplus)._M_p);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar8) {
        local_2b0._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_2b0._8_8_ = plVar4[3];
        local_2c0._M_dir._M_ptr = (element_type *)&local_2b0;
      }
      else {
        local_2b0._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_2c0._M_dir._M_ptr = (element_type *)*plVar4;
      }
      local_2c0._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1]
      ;
      *plVar4 = (long)paVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c0);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar8) {
        local_280.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_280.field_2._8_8_ = plVar4[3];
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      }
      else {
        local_280.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_280._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_280._M_string_length = plVar4[1];
      *plVar4 = (long)paVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::filesystem::__cxx11::path::path((path *)local_230,&local_280,auto_format);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_2f0,&local_310,auto_format);
      std::filesystem::copy((path *)local_230,&local_2f0,none);
      std::filesystem::__cxx11::path::~path(&local_2f0);
      std::filesystem::__cxx11::path::~path((path *)local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dir._M_ptr != &local_2b0) {
        operator_delete(local_2c0._M_dir._M_ptr,local_2b0._M_allocated_capacity + 1);
      }
      paVar8 = &local_2f0._M_pathname.field_2;
      if (local_250[0] != local_240) {
        operator_delete(local_250[0],local_240[0] + 1);
      }
      std::ofstream::ofstream(local_230,(string *)&local_310,_S_app);
      __return_storage_ptr___00 = local_260;
      std::operator+(&local_2f0._M_pathname,"DNS.1 = ",local_2c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_230,local_2f0._M_pathname._M_dataplus._M_p,
                 local_2f0._M_pathname._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_pathname._M_dataplus._M_p != paVar8) {
        operator_delete(local_2f0._M_pathname._M_dataplus._M_p,
                        local_2f0._M_pathname.field_2._M_allocated_capacity + 1);
      }
      local_230 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = _operator_delete__;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
      build_path_command((string *)local_230,&local_2a0,local_2c8,main_dirpath_00);
      system((char *)local_230);
      local_2f0._M_pathname._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"localhost.crt","");
      build_path(__return_storage_ptr___00,&local_2a0,local_2c8,&local_2f0._M_pathname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_pathname._M_dataplus._M_p != paVar8) {
        operator_delete(local_2f0._M_pathname._M_dataplus._M_p,
                        local_2f0._M_pathname.field_2._M_allocated_capacity + 1);
      }
      if (local_230 != (undefined1  [8])local_220) {
        operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
LAB_001107a0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&mut);
      return __return_storage_ptr___00;
    }
    __p = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_2c0);
    std::filesystem::__cxx11::path::path((path *)local_230,__p);
    local_2f0._M_pathname._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f0,local_230,(char *)((long)local_230 + local_228));
    std::__cxx11::string::rfind((char *)&local_2f0,0x157c94,0xffffffffffffffff);
    cVar2 = std::filesystem::status((path *)local_230);
    if (cVar2 == '\x02') {
      std::__cxx11::string::substr((ulong)&local_310,(ulong)&local_2f0);
      _Var1._M_p = local_310._M_dataplus._M_p;
      if (local_310._M_string_length == local_2c8->_M_string_length) {
        if (local_310._M_string_length == 0) {
          bVar9 = true;
        }
        else {
          iVar3 = bcmp(local_310._M_dataplus._M_p,(local_2c8->_M_dataplus)._M_p,
                       local_310._M_string_length);
          bVar9 = iVar3 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_310.field_2) {
        operator_delete(_Var1._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if (bVar9) {
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"localhost.crt","");
        __return_storage_ptr___00 = local_260;
        build_path(local_260,&local_2a0,local_2c8,&local_310);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_pathname._M_dataplus._M_p != &local_2f0._M_pathname.field_2) {
          operator_delete(local_2f0._M_pathname._M_dataplus._M_p,
                          local_2f0._M_pathname.field_2._M_allocated_capacity + 1);
        }
        std::filesystem::__cxx11::path::~path((path *)local_230);
        if (local_2c0._M_dir._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_2c0._M_dir._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._M_string_length);
        }
        goto LAB_001107a0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_pathname._M_dataplus._M_p != &local_2f0._M_pathname.field_2) {
      operator_delete(local_2f0._M_pathname._M_dataplus._M_p,
                      local_2f0._M_pathname.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)local_230);
    std::filesystem::__cxx11::directory_iterator::operator++(&local_2c0);
  } while( true );
}

Assistant:

std::string generate_cert(const std::string& domain_name,
                            const std::string& main_dirpath) {
    std::lock_guard<std::mutex> m(mut);

    const std::string crt_dirpath = main_dirpath + std::string("/") + CERTS_DIRNAME;

    for(const auto& p : fs::directory_iterator(crt_dirpath)) {
        fs::path path = p.path();
        std::string path_string = path.string();
        size_t pos = path_string.rfind("/");
        if (fs::is_directory(path) && 
                path_string.substr(pos + 1, path_string.length()) == domain_name) {
            return build_path(crt_dirpath, domain_name, CRT_FILENAME);
        }
    }

    fs::create_directories(crt_dirpath + "/" + domain_name);

    std::string ext_filepath = build_path(crt_dirpath, domain_name, EXT_FILENAME);

    fs::copy(main_dirpath + std::string("/") + EXT_FILENAME, ext_filepath); {
        std::ofstream file(ext_filepath, std::ios::app);
        file << "DNS.1 = " + domain_name;
    }
    std::string command = build_path_command(crt_dirpath, domain_name, main_dirpath);

    int _ = std::system(command.c_str());

    return build_path(crt_dirpath, domain_name, CRT_FILENAME);
}